

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lddgraph.hxx
# Opt level: O0

bool __thiscall lddgraph::removefile(lddgraph *this,string *file)

{
  int iVar1;
  char *__filename;
  ostream *poVar2;
  string *file_local;
  lddgraph *this_local;
  
  __filename = (char *)std::__cxx11::string::c_str();
  iVar1 = remove(__filename);
  if (iVar1 == 0) {
    this_local._7_1_ = true;
  }
  else {
    if ((this->_quiet & 1U) == 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Error: Unable to delete file ");
      poVar2 = std::operator<<(poVar2,(string *)file);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool removefile(const string & file)
    {
      if (remove(file.c_str()) != 0)
      {
        if (!_quiet)
          cerr << "Error: Unable to delete file " << file << endl;
        return false;
      }
      return true;
    }